

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O0

void __thiscall ixy::IxgbeDevice::wait_for_link(IxgbeDevice *this)

{
  LogData<ixy::Pair<ixy::None,_const_char_*>_> begin;
  LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_std::ios_base_&(&)(std::ios_base_&)>_>
  begin_00;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_std::ios_base_&(&)(std::ios_base_&)>,_const_unsigned_int_&>_>
  begin_01;
  int iVar1;
  undefined8 in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  uint local_b0;
  undefined1 local_a9 [9];
  LogData<ixy::Pair<ixy::None,_const_char_*>_> *local_a0;
  LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_std::ios_base_&(&)(std::ios_base_&)>_>
  local_98;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_std::ios_base_&(&)(std::ios_base_&)>,_const_unsigned_int_&>_>
  local_80;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_std::ios_base_&(&)(std::ios_base_&)>,_const_unsigned_int_&>,_const_char_*>_>
  local_60;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  int local_2c;
  int local_28;
  int poll_interval;
  int max_wait;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> *local_18;
  IxgbeDevice *local_10;
  IxgbeDevice *this_local;
  
  local_10 = this;
  memset((void *)((long)&poll_interval + 3),0,1);
  local_18 = ixy::operator<<("waiting for link...");
  info<ixy::Pair<ixy::None,char_const*>>
            ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp",
             0x1a9,"wait_for_link",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&max_wait);
  local_28 = 10000;
  local_2c = 10;
  while (iVar1 = (*(this->super_IxyDevice)._vptr_IxyDevice[10])(), iVar1 == 0 && 0 < local_28) {
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_38,&local_2c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
    local_28 = local_28 - local_2c;
  }
  memset(local_a9,0,1);
  local_a0 = ixy::operator<<("link speed is ");
  begin.list.second = in_stack_ffffffffffffff20;
  begin.list._0_8_ = in_stack_ffffffffffffff18;
  ixy::operator<<(&local_98,begin,(_func_ios_base_ptr_ios_base_ptr *)local_a0);
  local_b0 = (*(this->super_IxyDevice)._vptr_IxyDevice[10])();
  begin_00.list.first.second = local_98.list.first.second;
  begin_00.list.first._0_8_ = local_98.list.first._0_8_;
  begin_00.list.second = local_98.list.second;
  ixy::operator<<(&local_80,begin_00,&local_b0);
  begin_01.list.first.first.second = local_80.list.first.first.second;
  begin_01.list.first.first._0_8_ = local_80.list.first.first._0_8_;
  begin_01.list.first.second = local_80.list.first.second;
  begin_01.list.second = local_80.list.second;
  ixy::operator<<(&local_60,begin_01,(char (*) [8])" Mbit/s");
  info<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,std::ios_base&(&)(std::ios_base&)>,unsigned_int_const&>,char_const*>>
            ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp",
             0x1b0,"wait_for_link",&local_60);
  return;
}

Assistant:

void IxgbeDevice::wait_for_link() {
    info("waiting for link...");
    auto max_wait = 10000;    // 10 seconds in milliseconds
    auto poll_interval = 10; // milliseconds
    while (!(get_link_speed()) && max_wait > 0) {
        std::this_thread::sleep_for(std::chrono::milliseconds(poll_interval));
        max_wait -= poll_interval;
    }
    info("link speed is " << std::dec << get_link_speed() << " Mbit/s");
}